

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::FiberPool::Impl::~Impl(Impl *this)

{
  MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> *this_00;
  deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> *__x;
  uint uVar1;
  CoreLocalFreelist *pCVar2;
  FiberStack *pFVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> lock;
  deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> dangling;
  _Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> local_80;
  
  if (this->coreLocalFreelists != (CoreLocalFreelist *)0x0) {
    uVar1 = this->nproc;
    if ((ulong)uVar1 != 0) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        pCVar2 = this->coreLocalFreelists;
        lVar4 = 0;
        do {
          pFVar3 = *(FiberStack **)((long)&pCVar2->field_0 + lVar4 + lVar5);
          if (pFVar3 != (FiberStack *)0x0) {
            kj::_::FiberStack::~FiberStack(pFVar3);
            operator_delete(pFVar3,0x20);
          }
          lVar4 = lVar4 + 8;
        } while (lVar4 != 0x10);
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x40;
      } while (uVar6 != uVar1);
    }
    free(this->coreLocalFreelists);
  }
  this_00 = &this->freelist;
  local_80._M_impl.super__Deque_impl_data._M_map._0_1_ = 0;
  kj::_::Mutex::lock(&this_00->mutex,0);
  __x = &(this->freelist).value;
  std::_Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::_Deque_base
            (&local_80,
             &__x->super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>);
  while (local_80._M_impl.super__Deque_impl_data._M_start._M_cur !=
         local_80._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    pFVar3 = *local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (pFVar3 != (FiberStack *)0x0) {
      kj::_::FiberStack::~FiberStack(pFVar3);
      operator_delete(pFVar3,0x20);
    }
    local_80._M_impl.super__Deque_impl_data._M_start._M_cur =
         local_80._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
    if (local_80._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_80._M_impl.super__Deque_impl_data._M_start._M_last) {
      local_80._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_80._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_80._M_impl.super__Deque_impl_data._M_start._M_node =
           local_80._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      local_80._M_impl.super__Deque_impl_data._M_start._M_last =
           local_80._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
    }
  }
  std::_Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::~_Deque_base
            (&local_80);
  if (this_00 !=
      (MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> *)0x0) {
    kj::_::Mutex::unlock(&this_00->mutex,EXCLUSIVE,(Waiter *)0x0);
  }
  std::_Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::~_Deque_base
            (&__x->super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>);
  kj::_::Mutex::~Mutex(&this_00->mutex);
  return;
}

Assistant:

~Impl() noexcept(false) {
#if USE_CORE_LOCAL_FREELISTS
    if (coreLocalFreelists != nullptr) {
      KJ_DEFER(free(coreLocalFreelists));

      for (uint i: kj::zeroTo(nproc)) {
        for (auto stack: coreLocalFreelists[i].stacks) {
          if (stack != nullptr) {
            delete stack;
          }
        }
      }
    }
#endif

    // Make sure we're not leaking anything from the global freelist either.
    auto lock = freelist.lockExclusive();
    auto dangling = kj::mv(*lock);
    for (auto& stack: dangling) {
      delete stack;
    }
  }